

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HastTest.cpp
# Opt level: O0

int main(void)

{
  reference_wrapper<CTSL::HashMap<int,_int,_std::hash<int>_>_> local_58;
  thread local_50;
  thread secondThread;
  reference_wrapper<CTSL::HashMap<int,_int,_std::hash<int>_>_> local_38;
  thread local_30;
  thread firstThread;
  HashMap<int,_int,_std::hash<int>_> integerMap;
  
  testSingleThread();
  CTSL::HashMap<int,_int,_std::hash<int>_>::HashMap
            ((HashMap<int,_int,_std::hash<int>_> *)&firstThread,0x407);
  local_38 = std::ref<CTSL::HashMap<int,int,std::hash<int>>>
                       ((HashMap<int,_int,_std::hash<int>_> *)&firstThread);
  std::thread::
  thread<void(&)(CTSL::HashMap<int,int,std::hash<int>>&),std::reference_wrapper<CTSL::HashMap<int,int,std::hash<int>>>,void>
            (&local_30,testMultiThreadIntegerKey_Func1,&local_38);
  local_58 = std::ref<CTSL::HashMap<int,int,std::hash<int>>>
                       ((HashMap<int,_int,_std::hash<int>_> *)&firstThread);
  std::thread::
  thread<void(&)(CTSL::HashMap<int,int,std::hash<int>>&),std::reference_wrapper<CTSL::HashMap<int,int,std::hash<int>>>,void>
            (&local_50,testMultiThreadIntegerKey_Func2,&local_58);
  std::thread::join();
  std::thread::join();
  std::thread::~thread(&local_50);
  std::thread::~thread(&local_30);
  CTSL::HashMap<int,_int,_std::hash<int>_>::~HashMap
            ((HashMap<int,_int,_std::hash<int>_> *)&firstThread);
  return 0;
}

Assistant:

int main()
{
  testSingleThread(); // Single threaded test

  // Multi threaded test with two threads
  CTSL::HashMap<int, int> integerMap;
  std::thread firstThread(testMultiThreadIntegerKey_Func1, ref(integerMap));
  std::thread secondThread(testMultiThreadIntegerKey_Func2, ref(integerMap));

  firstThread.join();
  secondThread.join();

  return 0;
}